

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O0

char * asmjit::_abi_1_10::Support::findPackedString(char *p,uint32_t id)

{
  uint32_t i;
  uint32_t id_local;
  char *p_local;
  
  p_local = p;
  for (i = 0; i < id; i = i + 1) {
    for (; *p_local != '\0'; p_local = p_local + 1) {
    }
    p_local = p_local + 1;
  }
  return p_local;
}

Assistant:

static ASMJIT_FORCE_INLINE const char* findPackedString(const char* p, uint32_t id) noexcept {
  uint32_t i = 0;
  while (i < id) {
    while (p[0])
      p++;
    p++;
    i++;
  }
  return p;
}